

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

void it_send_midi(DUMB_IT_SIGRENDERER *sigrenderer,IT_CHANNEL *channel,uchar midi_byte)

{
  char *pcVar1;
  uchar uVar2;
  _func_int_void_ptr_int_uchar *p_Var3;
  uchar uVar4;
  int iVar5;
  long lVar6;
  
  p_Var3 = sigrenderer->callbacks->midi;
  if ((p_Var3 != (_func_int_void_ptr_int_uchar *)0x0) &&
     (iVar5 = (*p_Var3)(sigrenderer->callbacks->midi_data,
                        (int)((ulong)((long)channel + (-0x20 - (long)sigrenderer)) >> 5) *
                        -0x33333333,midi_byte), iVar5 != 0)) {
    return;
  }
  uVar2 = channel->midi_state;
  if (uVar2 == '\x02') {
    uVar4 = '\x03';
    if (midi_byte != '\0') {
      uVar4 = (midi_byte == '\x01') << 2;
    }
    goto LAB_005b7535;
  }
  if (uVar2 == '\x03') {
    if (-1 < (char)midi_byte) {
      channel->filter_cutoff = midi_byte;
    }
  }
  else if (uVar2 == '\x04') {
    if (-1 < (char)midi_byte) {
      channel->filter_resonance = midi_byte;
    }
  }
  else {
    uVar4 = '\0';
    if (midi_byte < 0xfc) {
      if (midi_byte == 0xf0) {
        uVar4 = uVar2 + '\x01';
        goto LAB_005b7535;
      }
      if (midi_byte != 0xfa) goto LAB_005b7535;
    }
    else if ((midi_byte != 0xfc) && (midi_byte != 0xff)) goto LAB_005b7535;
    lVar6 = 0x32;
    do {
      pcVar1 = sigrenderer->channel[0].arpeggio_offsets + lVar6 + -0x51;
      pcVar1[0] = '\x7f';
      pcVar1[1] = '\0';
      lVar6 = lVar6 + 0xa0;
    } while (lVar6 != 0x2832);
  }
  uVar4 = '\0';
LAB_005b7535:
  channel->midi_state = uVar4;
  return;
}

Assistant:

static void it_send_midi(DUMB_IT_SIGRENDERER *sigrenderer, IT_CHANNEL *channel, unsigned char midi_byte)
{
	if (sigrenderer->callbacks->midi)
		if ((*sigrenderer->callbacks->midi)(sigrenderer->callbacks->midi_data, (int)(channel - sigrenderer->channel), midi_byte))
			return;

	switch (channel->midi_state) {
		case 4: /* Ready to receive resonance parameter */
			if (midi_byte < 0x80) channel->filter_resonance = midi_byte;
			channel->midi_state = 0;
			break;
		case 3: /* Ready to receive cutoff parameter */
			if (midi_byte < 0x80) channel->filter_cutoff = midi_byte;
			channel->midi_state = 0;
			break;
		case 2: /* Ready for byte specifying which parameter will follow */
			if (midi_byte == 0) /* Cutoff */
				channel->midi_state = 3;
			else if (midi_byte == 1) /* Resonance */
				channel->midi_state = 4;
			else
				channel->midi_state = 0;
			break;
		default: /* Counting initial F0 bytes */
			switch (midi_byte) {
				case 0xF0:
					channel->midi_state++;
					break;
				case 0xFA:
				case 0xFC:
				case 0xFF:
					/* Reset filter parameters for all channels */
					{
						int i;
						for (i = 0; i < DUMB_IT_N_CHANNELS; i++) {
							sigrenderer->channel[i].filter_cutoff = 127;
							sigrenderer->channel[i].filter_resonance = 0;
							//// should we be resetting channel[i].playing->filter_* here?
						}
					}
					/* Fall through */
				default:
					channel->midi_state = 0;
					break;
			}
	}
}